

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O2

mod2entry * mod2sparse_find(mod2sparse *m,int row,int col)

{
  uint uVar1;
  int iVar2;
  mod2entry *pmVar3;
  mod2entry *pmVar4;
  mod2entry *pmVar5;
  
  if ((((row < 0) || (col < 0)) || (m->n_rows <= row)) || (m->n_cols <= col)) {
    fwrite("mod2sparse_find: row or column index out of bounds\n",0x33,1,_stderr);
    exit(1);
  }
  pmVar3 = m->rows[(uint)row].left;
  if (-1 < pmVar3->row) {
    pmVar5 = m->rows + (uint)row;
    if (col <= pmVar3->col) {
      if (pmVar3->col == col) {
        return pmVar3;
      }
      pmVar3 = m->cols + (uint)col;
      pmVar4 = m->cols[(uint)col].up;
      uVar1 = pmVar4->row;
      if (row <= (int)uVar1) {
        do {
          if (uVar1 == row) {
            return pmVar4;
          }
          pmVar5 = pmVar5->right;
          if (pmVar5->row < 0) {
            return (mod2entry *)0x0;
          }
          iVar2 = pmVar5->col;
          if (iVar2 != col && col <= iVar2) {
            return (mod2entry *)0x0;
          }
          if (iVar2 == col) {
            return pmVar5;
          }
          pmVar3 = pmVar3->down;
          uVar1 = pmVar3->row;
          pmVar4 = pmVar3;
        } while (uVar1 <= (uint)row);
      }
    }
  }
  return (mod2entry *)0x0;
}

Assistant:

mod2entry *mod2sparse_find
( mod2sparse *m,
  int row,
  int col
)
{ 
  mod2entry *re, *ce;

  if (row<0 || row>=mod2sparse_rows(m) || col<0 || col>=mod2sparse_cols(m))
  { fprintf(stderr,"mod2sparse_find: row or column index out of bounds\n");
    exit(1);
  }

  /* Check last entries in row and column. */

  re = mod2sparse_last_in_row(m,row);
  if (mod2sparse_at_end(re) || mod2sparse_col(re)<col) 
  { return 0;
  }
  if (mod2sparse_col(re)==col) 
  { return re;
  }

  ce = mod2sparse_last_in_col(m,col);
  if (mod2sparse_at_end(ce) || mod2sparse_row(ce)<row)
  { return 0;
  }
  if (mod2sparse_row(ce)==row)
  { return ce;
  }

  /* Search row and column in parallel, from the front. */

  re = mod2sparse_first_in_row(m,row);
  ce = mod2sparse_first_in_col(m,col);

  for (;;)
  { 
    if (mod2sparse_at_end(re) || mod2sparse_col(re)>col)
    { return 0;
    } 
    if (mod2sparse_col(re)==col) 
    { return re;
    }

    if (mod2sparse_at_end(ce) || mod2sparse_row(ce)>row)
    { return 0;
    } 
    if (mod2sparse_row(ce)==row)
    { return ce;
    }

    re = mod2sparse_next_in_row(re);
    ce = mod2sparse_next_in_col(ce);
  }
}